

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall btRaycastVehicle::resetSuspension(btRaycastVehicle *this)

{
  btWheelInfo *pbVar1;
  long lVar2;
  btScalar (*pabVar3) [4];
  long lVar4;
  btScalar bVar5;
  btVector3 bVar6;
  
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < (this->m_wheelInfo).m_size; lVar2 = lVar2 + 1) {
    pbVar1 = (this->m_wheelInfo).m_data;
    bVar5 = btWheelInfo::getSuspensionRestLength
                      ((btWheelInfo *)
                       ((long)(pbVar1->m_raycastInfo).m_contactNormalWS.m_floats + lVar4));
    pabVar3 = (btScalar (*) [4])((long)(pbVar1->m_raycastInfo).m_contactNormalWS.m_floats + lVar4);
    pabVar3[2][0] = bVar5;
    pabVar3[0x11][3] = 0.0;
    bVar6 = operator-((btVector3 *)(pabVar3[3] + 1));
    *pabVar3 = bVar6.m_floats;
    pabVar3[0x11][2] = 1.0;
    lVar4 = lVar4 + 0x128;
  }
  return;
}

Assistant:

void btRaycastVehicle::resetSuspension()
{

	int i;
	for (i=0;i<m_wheelInfo.size();	i++)
	{
			btWheelInfo& wheel = m_wheelInfo[i];
			wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			
			wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
			//wheel_info.setContactFriction(btScalar(0.0));
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}